

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O3

void __thiscall gvr::Mesh::recalculateNormals(Mesh *this)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  float *pfVar5;
  float *pfVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  uint *puVar10;
  int k;
  long lVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  iVar2 = (this->super_PointCloud).n;
  if (0 < iVar2) {
    iVar7 = iVar2 * 3;
    iVar8 = 1;
    if (iVar7 < 1) {
      iVar8 = iVar7;
    }
    memset(this->normal + ((ulong)(iVar2 * 3 - 1) - (ulong)(uint)(iVar7 - iVar8)),0,
           (ulong)(uint)(iVar7 - iVar8) * 4 + 4);
  }
  iVar2 = this->n;
  if (0 < (long)iVar2) {
    puVar4 = this->triangle;
    pfVar5 = (this->super_PointCloud).vertex;
    pfVar6 = this->normal;
    lVar9 = 0;
    puVar10 = puVar4;
    do {
      lVar11 = (long)(int)puVar4[lVar9 * 3 + 1];
      lVar12 = (long)(int)puVar4[lVar9 * 3];
      fVar17 = pfVar5[lVar11 * 3] - pfVar5[lVar12 * 3];
      fVar15 = pfVar5[lVar11 * 3 + 1] - pfVar5[lVar12 * 3 + 1];
      fVar13 = pfVar5[lVar11 * 3 + 2] - pfVar5[lVar12 * 3 + 2];
      lVar11 = (long)(int)puVar4[lVar9 * 3 + 2];
      fVar19 = pfVar5[lVar11 * 3] - pfVar5[lVar12 * 3];
      fVar14 = pfVar5[lVar11 * 3 + 1] - pfVar5[lVar12 * 3 + 1];
      fVar18 = pfVar5[lVar11 * 3 + 2] - pfVar5[lVar12 * 3 + 2];
      fVar16 = fVar15 * fVar18 - fVar14 * fVar13;
      fVar13 = fVar13 * fVar19 - fVar18 * fVar17;
      fVar14 = fVar14 * fVar17 - fVar19 * fVar15;
      fVar15 = SQRT(fVar14 * fVar14 + fVar16 * fVar16 + fVar13 * fVar13);
      if (0.0 < fVar15) {
        lVar11 = 0;
        do {
          uVar3 = puVar10[lVar11];
          pfVar6[uVar3 * 3] = pfVar6[uVar3 * 3] + fVar16 / fVar15;
          uVar1 = uVar3 * 3 + 1;
          pfVar6[uVar1] = pfVar6[uVar1] + fVar13 / fVar15;
          uVar1 = uVar3 * 3 + 2;
          pfVar6[uVar1] = pfVar6[uVar1] + fVar14 / fVar15;
          lVar11 = lVar11 + 1;
        } while (lVar11 != 3);
      }
      lVar9 = lVar9 + 1;
      puVar10 = puVar10 + 3;
    } while (lVar9 != iVar2);
  }
  normalizeNormals(this);
  return;
}

Assistant:

void Mesh::recalculateNormals()
{
  for (int i=3*getVertexCount()-1; i>=0; i--)
  {
    normal[i]=0;
  }

  /* compute normals of triangles and sum for each vertex */

  for (int i=0; i<n; i++)
  {
    float x0=getVertexComp(triangle[3*i+1], 0)-getVertexComp(triangle[3*i], 0);
    float y0=getVertexComp(triangle[3*i+1], 1)-getVertexComp(triangle[3*i], 1);
    float z0=getVertexComp(triangle[3*i+1], 2)-getVertexComp(triangle[3*i], 2);

    float x1=getVertexComp(triangle[3*i+2], 0)-getVertexComp(triangle[3*i], 0);
    float y1=getVertexComp(triangle[3*i+2], 1)-getVertexComp(triangle[3*i], 1);
    float z1=getVertexComp(triangle[3*i+2], 2)-getVertexComp(triangle[3*i], 2);

    float nx=y0*z1-z0*y1;
    float ny=z0*x1-x0*z1;
    float nz=x0*y1-y0*x1;

    float len=sqrt(nx*nx+ny*ny+nz*nz);

    if (len > 0)
    {
      nx/=len;
      ny/=len;
      nz/=len;

      for (int k=0; k<3; k++)
      {
        normal[3*triangle[3*i+k]]+=nx;
        normal[3*triangle[3*i+k]+1]+=ny;
        normal[3*triangle[3*i+k]+2]+=nz;
      }
    }
  }

  /* normalize to length 1 */

  normalizeNormals();
}